

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

BigPropertyIndex __thiscall
Js::SimpleTypeHandler<3UL>::GetPropertyIndex_EnumerateTTD
          (SimpleTypeHandler<3UL> *this,PropertyRecord *pRecord)

{
  uint uVar1;
  
  if (0 < this->propertyCount) {
    uVar1 = 0;
    do {
      uVar1 = uVar1 & 0xffff;
      if (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar1 << 4)) + 8) ==
          pRecord->pid) {
        if ((*(byte *)((long)&this->descriptors[0].field_1 + (ulong)(uVar1 << 4)) & 8) == 0) {
          return uVar1;
        }
        TTDAbort_unrecoverable_error("How is this deleted but we enumerated it anyway???");
      }
      uVar1 = uVar1 + 1;
    } while ((uVar1 & 0xffff) < (uint)this->propertyCount);
  }
  TTDAbort_unrecoverable_error("We found this during enum so what is going on here?");
}

Assistant:

Js::BigPropertyIndex SimpleTypeHandler<size>::GetPropertyIndex_EnumerateTTD(const Js::PropertyRecord* pRecord)
    {
        PropertyIndex index;
        if(this->GetDescriptor(pRecord->GetPropertyId(), &index))
        {
            TTDAssert(!(this->descriptors[index].Attributes & PropertyDeleted), "How is this deleted but we enumerated it anyway???");

            return (Js::BigPropertyIndex)index;
        }

        TTDAssert(false, "We found this during enum so what is going on here?");
        return Js::Constants::NoBigSlot;
    }